

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_199c2b::TargetTask::inputsAvailable(TargetTask *this,TaskInterface ti)

{
  uint uVar1;
  void **ppvVar2;
  Twine *pTVar3;
  _func_int **pp_Var4;
  _func_int *p_Var5;
  _func_int *p_Var6;
  Child CVar7;
  Child CVar8;
  bool bVar9;
  raw_ostream *prVar10;
  BuildEngineDelegate *pBVar11;
  uint *puVar12;
  NodeKind NVar13;
  Child CVar14;
  Child CVar15;
  Child CVar16;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  string inputs;
  raw_string_ostream inputsStream;
  Child local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  Child local_198;
  Child CStack_190;
  undefined8 local_188;
  Child local_178;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined8 local_168;
  string local_158;
  Child local_138;
  void *pvStack_130;
  uint local_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  NodeKind local_110;
  char cStack_10f;
  undefined6 uStack_10e;
  uint local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  NodeKind local_f8;
  char cStack_f7;
  undefined6 uStack_f6;
  uint local_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  NodeKind local_e0;
  char cStack_df;
  undefined6 uStack_de;
  uint local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  NodeKind local_c8;
  char cStack_c7;
  undefined6 uStack_c6;
  BuildValue local_c0;
  StringRef local_50;
  undefined8 local_40;
  undefined4 local_38;
  
  pvStack_130 = ti.ctx;
  local_138 = (Child)ti.impl;
  bVar9 = llbuild::core::TaskInterface::isCancelled((TaskInterface *)&local_138);
  if (bVar9) {
    local_c0.kind = SkippedCommand;
    goto LAB_001502d5;
  }
  uVar1 = (this->missingInputNodes).super_SmallPtrSetImpl<llbuild::buildsystem::Node_*>.
          super_SmallPtrSetImplBase.NumNonEmpty;
  if (uVar1 != (this->missingInputNodes).super_SmallPtrSetImpl<llbuild::buildsystem::Node_*>.
               super_SmallPtrSetImplBase.NumTombstones) {
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    local_158._M_string_length = 0;
    local_158.field_2._M_local_buf[0] = '\0';
    local_c0.valueData.asOutputInfo.mode._0_4_ = 1;
    local_c0.signature.value._0_4_ = 0;
    local_c0.signature.value._4_4_ = 0;
    local_c0.valueData.asOutputInfo.device._0_4_ = 0;
    local_c0.valueData.asOutputInfo.device._4_4_ = 0;
    local_c0.valueData.asOutputInfo.inode._0_4_ = 0;
    local_c0.valueData.asOutputInfo.inode._4_4_ = 0;
    local_c0.kind = 0x20d278;
    local_c0.numOutputInfos = 0;
    local_c0.valueData.asOutputInfo.size = (uint64_t)&local_158;
    local_198 = (Child)(this->missingInputNodes).super_SmallPtrSetImpl<llbuild::buildsystem::Node_*>
                       .super_SmallPtrSetImplBase.CurArray;
    if (local_198.twine !=
        (Twine *)(this->missingInputNodes).super_SmallPtrSetImpl<llbuild::buildsystem::Node_*>.
                 super_SmallPtrSetImplBase.SmallArray) {
      uVar1 = (this->missingInputNodes).super_SmallPtrSetImpl<llbuild::buildsystem::Node_*>.
              super_SmallPtrSetImplBase.CurArraySize;
    }
    CStack_190.decUL = (unsigned_long *)(&(local_198.twine)->LHS + uVar1);
    llvm::SmallPtrSetIteratorImpl::AdvanceIfNotValid((SmallPtrSetIteratorImpl *)&local_198);
    local_1b8.twine = local_198.twine;
    uStack_1b0 = CStack_190.twine;
    ppvVar2 = (this->missingInputNodes).super_SmallPtrSetImpl<llbuild::buildsystem::Node_*>.
              super_SmallPtrSetImplBase.CurArray;
    puVar12 = &(this->missingInputNodes).super_SmallPtrSetImpl<llbuild::buildsystem::Node_*>.
               super_SmallPtrSetImplBase.NumNonEmpty;
    if (ppvVar2 !=
        (this->missingInputNodes).super_SmallPtrSetImpl<llbuild::buildsystem::Node_*>.
        super_SmallPtrSetImplBase.SmallArray) {
      puVar12 = &(this->missingInputNodes).super_SmallPtrSetImpl<llbuild::buildsystem::Node_*>.
                 super_SmallPtrSetImplBase.CurArraySize;
    }
    local_198.decUL = (unsigned_long *)(ppvVar2 + *puVar12);
    CStack_190.decUL = local_198.decUL;
    llvm::SmallPtrSetIteratorImpl::AdvanceIfNotValid((SmallPtrSetIteratorImpl *)&local_198);
    CVar15 = local_198;
    if (local_1b8.twine != local_198.twine) {
      do {
        if (uStack_1b0 <= local_1b8.twine) {
LAB_00150347:
          __assert_fail("Bucket < End",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallPtrSet.h"
                        ,0x122,
                        "const PtrTy llvm::SmallPtrSetIterator<llbuild::buildsystem::Node *>::operator*() const [PtrTy = llbuild::buildsystem::Node *]"
                       );
        }
        pTVar3 = (Twine *)*local_1b8.decUL;
        local_198 = (Child)(this->missingInputNodes).
                           super_SmallPtrSetImpl<llbuild::buildsystem::Node_*>.
                           super_SmallPtrSetImplBase.CurArray;
        CStack_190.decUL =
             (unsigned_long *)
             (&(local_198.twine)->LHS +
             *(uint *)((long)(this->missingInputNodes).SmallStorage +
                      (ulong)(local_198.twine ==
                             (Twine *)(this->missingInputNodes).
                                      super_SmallPtrSetImpl<llbuild::buildsystem::Node_*>.
                                      super_SmallPtrSetImplBase.SmallArray) * 4 + -0x10));
        llvm::SmallPtrSetIteratorImpl::AdvanceIfNotValid((SmallPtrSetIteratorImpl *)&local_198);
        if (CStack_190.twine <= local_198.twine) goto LAB_00150347;
        if (pTVar3 != ((Child *)&(local_198.stringRef)->Data)->twine) {
          Str.Length = 2;
          Str.Data = ", ";
          llvm::raw_ostream::operator<<((raw_ostream *)&local_c0,Str);
        }
        Str_00.Length = 1;
        Str_00.Data = "\'";
        prVar10 = llvm::raw_ostream::operator<<((raw_ostream *)&local_c0,Str_00);
        prVar10 = llvm::raw_ostream::operator<<(prVar10,*(StringRef *)&pTVar3->RHS);
        Str_01.Length = 1;
        Str_01.Data = "\'";
        llvm::raw_ostream::operator<<(prVar10,Str_01);
        local_1b8.twine = (Twine *)&(local_1b8.stdString)->_M_string_length;
        llvm::SmallPtrSetIteratorImpl::AdvanceIfNotValid((SmallPtrSetIteratorImpl *)&local_1b8);
      } while (local_1b8.twine != CVar15.twine);
    }
    if (CONCAT44(local_c0.valueData.asOutputInfo.inode._4_4_,
                 local_c0.valueData.asOutputInfo.inode._0_4_) !=
        CONCAT44(local_c0.signature.value._4_4_,(undefined4)local_c0.signature.value)) {
      llvm::raw_ostream::flush_nonempty((raw_ostream *)&local_c0);
    }
    local_198 = local_138;
    CStack_190 = (Child)pvStack_130;
    pBVar11 = llbuild::core::TaskInterface::delegate((TaskInterface *)&local_198);
    pp_Var4 = pBVar11[1]._vptr_BuildEngineDelegate;
    p_Var5 = pp_Var4[3];
    p_Var6 = pp_Var4[4];
    llvm::Twine::Twine((Twine *)&local_d8,"cannot build target \'");
    local_50.Data = (this->target->name)._M_dataplus._M_p;
    local_50.Length = (this->target->name)._M_string_length;
    llvm::Twine::Twine((Twine *)&local_f0,&local_50);
    if ((local_c8 == NullKind) || (local_e0 == NullKind)) {
      local_168 = CONCAT62(local_168._2_6_,0x100);
    }
    else if (local_c8 == EmptyKind) {
      local_168 = CONCAT62(uStack_de,CONCAT11(cStack_df,local_e0));
      local_178.decUI = local_f0;
      local_178._4_4_ = uStack_ec;
      uStack_170 = uStack_e8;
      uStack_16c = uStack_e4;
    }
    else if (local_e0 == EmptyKind) {
      local_168 = CONCAT62(uStack_c6,CONCAT11(cStack_c7,local_c8));
      local_178.decUI = local_d8;
      local_178._4_4_ = uStack_d4;
      uStack_170 = uStack_d0;
      uStack_16c = uStack_cc;
    }
    else {
      CVar15._4_4_ = uStack_d4;
      CVar15.decUI = local_d8;
      if (cStack_c7 != '\x01') {
        local_c8 = TwineKind;
        CVar15.twine = (Twine *)&local_d8;
      }
      if (cStack_df != '\x01') {
        local_e0 = TwineKind;
      }
      CVar16._4_4_ = uStack_ec;
      CVar16.decUI = local_f0;
      CVar14.twine = (Twine *)&local_f0;
      if (cStack_df == '\x01') {
        CVar14 = CVar16;
      }
      llvm::Twine::Twine((Twine *)&local_178,CVar15,local_c8,CVar14,local_e0);
    }
    llvm::Twine::Twine((Twine *)&local_108,"\' due to missing inputs: ");
    if (((NodeKind)local_168 == NullKind) || (local_f8 == NullKind)) {
      local_1a8 = CONCAT62(local_1a8._2_6_,0x100);
    }
    else {
      if ((NodeKind)local_168 == EmptyKind) {
        local_1a8 = CONCAT62(uStack_f6,CONCAT11(cStack_f7,local_f8));
      }
      else {
        if (local_f8 != EmptyKind) {
          CVar14._4_4_ = local_178._4_4_;
          CVar14.decUI = local_178.decUI;
          NVar13 = (NodeKind)local_168;
          if (local_168._1_1_ != '\x01') {
            CVar14.twine = (Twine *)&local_178;
            NVar13 = TwineKind;
          }
          if (cStack_f7 != '\x01') {
            local_f8 = TwineKind;
          }
          CVar8._4_4_ = uStack_104;
          CVar8.decUI = local_108;
          CVar15.twine = (Twine *)&local_108;
          if (cStack_f7 == '\x01') {
            CVar15 = CVar8;
          }
          llvm::Twine::Twine((Twine *)&local_1b8,CVar14,NVar13,CVar15,local_f8);
          goto LAB_001501bd;
        }
        local_1a8 = local_168;
        local_108 = local_178.decUI;
        uStack_104 = local_178._4_4_;
        uStack_100 = uStack_170;
        uStack_fc = uStack_16c;
      }
      local_1b8._4_4_ = uStack_104;
      local_1b8.decUI = local_108;
      uStack_1b0 = (Twine *)CONCAT44(uStack_fc,uStack_100);
    }
LAB_001501bd:
    llvm::Twine::Twine((Twine *)&local_120,&local_158);
    if (((NodeKind)local_1a8 == NullKind) || (local_110 == NullKind)) {
      local_188 = CONCAT62(local_188._2_6_,0x100);
    }
    else {
      if ((NodeKind)local_1a8 == EmptyKind) {
        local_188 = CONCAT62(uStack_10e,CONCAT11(cStack_10f,local_110));
      }
      else {
        if (local_110 != EmptyKind) {
          CVar15 = local_1b8;
          NVar13 = (NodeKind)local_1a8;
          if (local_1a8._1_1_ != '\x01') {
            CVar15.twine = (Twine *)&local_1b8;
            NVar13 = TwineKind;
          }
          if (cStack_10f != '\x01') {
            local_110 = TwineKind;
          }
          CVar7._4_4_ = uStack_11c;
          CVar7.decUI = local_120;
          CVar16.twine = (Twine *)&local_120;
          if (cStack_10f == '\x01') {
            CVar16 = CVar7;
          }
          llvm::Twine::Twine((Twine *)&local_198,CVar15,NVar13,CVar16,local_110);
          goto LAB_00150269;
        }
        local_188 = local_1a8;
        local_120 = local_1b8.decUI;
        uStack_11c = local_1b8._4_4_;
        uStack_118 = (undefined4)uStack_1b0;
        uStack_114 = uStack_1b0._4_4_;
      }
      local_198._4_4_ = uStack_11c;
      local_198.decUI = local_120;
      CStack_190._4_4_ = uStack_114;
      CStack_190.decUI = uStack_118;
    }
LAB_00150269:
    local_40 = 0;
    local_38 = 0;
    (**(code **)(*(long *)pp_Var4[1] + 0x18))(pp_Var4[1],p_Var5,p_Var6,&local_40,&local_198);
    (**(code **)(*(long *)pp_Var4[1] + 0x30))();
    llvm::raw_string_ostream::~raw_string_ostream((raw_string_ostream *)&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,
                      CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                               local_158.field_2._M_local_buf[0]) + 1);
    }
  }
  local_c0.kind = Target;
LAB_001502d5:
  local_c0.numOutputInfos = 0;
  local_c0.signature.value._0_4_ = 0;
  local_c0.signature.value._4_4_ = 0;
  local_c0.valueData.asOutputInfo.device._0_4_ = 0;
  local_c0.valueData.asOutputInfo.device._4_4_ = 0;
  local_c0.valueData.asOutputInfo.inode._0_4_ = 0;
  local_c0.valueData.asOutputInfo.inode._4_4_ = 0;
  local_c0.valueData.asOutputInfo.mode._0_4_ = 0;
  local_c0.valueData.asOutputInfo.mode._4_4_ = 0;
  local_c0.valueData.asOutputInfo.size._0_4_ = 0;
  local_c0.valueData.asOutputInfo.size._4_4_ = 0;
  local_c0.valueData.asOutputInfo.modTime.seconds._0_4_ = 0;
  local_c0.valueData._36_8_ = 0;
  local_c0.valueData._44_8_ = 0;
  local_c0.valueData._52_8_ = 0;
  local_c0.valueData._60_8_ = 0;
  local_c0.valueData._68_8_ = 0;
  local_c0.valueData._76_4_ = 0;
  local_c0.stringValues.contents._0_4_ = 0;
  local_c0.stringValues.contents._4_4_ = 0;
  local_c0.stringValues.size = 0;
  llbuild::buildsystem::BuildValue::toData((ValueType *)&local_158,&local_c0);
  llbuild::core::TaskInterface::complete((TaskInterface *)&local_138,(ValueType *)&local_158,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_158._M_dataplus._M_p,
                    CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                             local_158.field_2._M_local_buf[0]) - (long)local_158._M_dataplus._M_p);
  }
  llbuild::buildsystem::BuildValue::~BuildValue(&local_c0);
  return;
}

Assistant:

virtual void inputsAvailable(TaskInterface ti) override {
    // If the build should cancel, do nothing.
    if (ti.isCancelled()) {
      ti.complete(BuildValue::makeSkippedCommand().toData());
      return;
    }

    if (!missingInputNodes.empty()) {
      std::string inputs;
      raw_string_ostream inputsStream(inputs);
      for (Node* missingInputNode : missingInputNodes) {
        if (missingInputNode != *missingInputNodes.begin()) {
          inputsStream << ", ";
        }
        inputsStream << "'" << missingInputNode->getName() << "'";
      }
      inputsStream.flush();

      // FIXME: Design the logging and status output APIs.
      auto& system = getBuildSystem(ti);
      system.error(system.getMainFilename(),
                   (Twine("cannot build target '") + target.getName() +
                    "' due to missing inputs: " + inputs));
      
      // Report the command failure.
      system.getDelegate().hadCommandFailure();
    }
    
    // Complete the task immediately.
    ti.complete(BuildValue::makeTarget().toData());
  }